

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<Indexing::CodeTree::MatchInfo_*>::expand
          (DArray<Indexing::CodeTree::MatchInfo_*> *this,size_t s)

{
  undefined8 *__ptr;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  void *pvVar6;
  ulong in_RSI;
  ulong *in_RDI;
  MatchInfo **newAddr;
  MatchInfo **oldAddr;
  MatchInfo **afterLast;
  MatchInfo **firstEmpty;
  MatchInfo **nptr;
  MatchInfo **optr;
  MatchInfo **oldArr;
  void *mem;
  size_t newCapacity;
  size_t oldCapacity;
  undefined8 *local_48;
  undefined8 *local_40;
  unsigned_long local_28;
  unsigned_long local_20;
  ulong local_18;
  ulong local_10 [2];
  
  if (in_RDI[1] < in_RSI) {
    local_18 = in_RDI[1];
    local_28 = local_18 << 1;
    local_10[0] = in_RSI;
    puVar5 = std::max<unsigned_long>(local_10,&local_28);
    local_20 = *puVar5;
    pvVar6 = Lib::alloc((size_t)in_RDI);
    __ptr = (undefined8 *)in_RDI[2];
    in_RDI[1] = local_20;
    in_RDI[2] = (ulong)pvVar6;
    uVar1 = in_RDI[2];
    uVar2 = *in_RDI;
    uVar3 = in_RDI[2];
    uVar4 = in_RDI[1];
    local_48 = (undefined8 *)in_RDI[2];
    local_40 = __ptr;
    while (local_48 != (undefined8 *)(uVar1 + uVar2 * 8)) {
      *local_48 = *local_40;
      local_48 = local_48 + 1;
      local_40 = local_40 + 1;
    }
    while (local_48 != (undefined8 *)(uVar3 + uVar4 * 8)) {
      *local_48 = 0;
      local_48 = local_48 + 1;
    }
    *in_RDI = local_10[0];
    if (__ptr != (undefined8 *)0x0) {
      Lib::free(__ptr);
    }
  }
  else {
    *in_RDI = in_RSI;
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }